

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadString(CodedInputStream *this,string *buffer,int size)

{
  int iVar1;
  LogMessage *other;
  pair<char_*,_bool> pVar2;
  int size_local;
  string *buffer_local;
  CodedInputStream *this_local;
  byte local_81;
  LogMessage local_80;
  char *local_48;
  undefined1 local_40;
  char *local_38;
  pair<char_*,_bool> z;
  bool local_9;
  
  if (size < 0) {
    this_local._2_1_ = false;
  }
  else {
    if (size < 0) {
      local_9 = false;
    }
    else {
      z._12_4_ = size;
      iVar1 = BufferSize(this);
      if (iVar1 < (int)z._12_4_) {
        local_9 = ReadStringFallback(this,buffer,z._12_4_);
      }
      else {
        STLStringResizeUninitialized(buffer,(long)(int)z._12_4_);
        pVar2 = as_string_data(buffer);
        local_48 = pVar2.first;
        local_40 = pVar2.second;
        if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_81 = 0;
          local_38 = local_48;
          z.first._0_1_ = local_40;
          if (local_48 == (char *)0x0) {
            internal::LogMessage::LogMessage
                      (&local_80,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream_inl.h"
                       ,0x3c);
            local_81 = 1;
            other = internal::LogMessage::operator<<(&local_80,"CHECK failed: z.first != NULL: ");
            internal::LogFinisher::operator=((LogFinisher *)((long)&this_local + 3),other);
          }
          if ((local_81 & 1) != 0) {
            internal::LogMessage::~LogMessage(&local_80);
          }
          memcpy(local_38,this->buffer_,(long)(int)z._12_4_);
          Advance(this,z._12_4_);
        }
        local_9 = true;
      }
    }
    this_local._2_1_ = local_9;
  }
  return this_local._2_1_;
}

Assistant:

bool CodedInputStream::ReadString(string* buffer, int size) {
  if (size < 0) return false;  // security: size is often user-supplied
  return InternalReadStringInline(buffer, size);
}